

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_ptr.hpp
# Opt level: O0

void __thiscall
AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
          (AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *this,OPNChipBase *p)

{
  size_t sVar1;
  size_t *psVar2;
  ADLMIDI_DefaultDelete<OPNChipBase> local_19;
  OPNChipBase *pOStack_18;
  ADLMIDI_DefaultDelete<OPNChipBase> del;
  OPNChipBase *p_local;
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *this_local;
  
  if (p != this->m_p) {
    pOStack_18 = p;
    if (((this->m_p != (OPNChipBase *)0x0) &&
        (sVar1 = *this->m_counter - 1, *this->m_counter = sVar1, sVar1 == 0)) &&
       (ADLMIDI_DefaultDelete<OPNChipBase>::operator()(&local_19,this->m_p),
       pOStack_18 == (OPNChipBase *)0x0)) {
      if (this->m_counter != (size_t *)0x0) {
        operator_delete(this->m_counter);
      }
      this->m_counter = (size_t *)0x0;
    }
    this->m_p = pOStack_18;
    if (pOStack_18 != (OPNChipBase *)0x0) {
      if (this->m_counter == (size_t *)0x0) {
        psVar2 = (size_t *)operator_new(8);
        this->m_counter = psVar2;
      }
      *this->m_counter = 1;
    }
  }
  return;
}

Assistant:

void reset(T *p = NULL)
    {
        if(p != m_p) {
            if(m_p && --*m_counter == 0) {
                Deleter del;
                del(m_p);
                if(!p) {
                    delete m_counter;
                    m_counter = NULL;
                }
            }
            m_p = p;
            if(p) {
                if(!m_counter)
                    m_counter = new size_t;
                *m_counter = 1;
            }
        }
    }